

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  reference ppcVar1;
  memory_buf_t *dest_00;
  const_reference ppcVar2;
  scoped_padder *this_00;
  scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff38;
  size_t *psVar3;
  buffer<char> *in_stack_ffffffffffffff40;
  memory_buf_t *in_stack_ffffffffffffff48;
  padding_info *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  scoped_padder *in_stack_ffffffffffffff60;
  value_type pcVar4;
  memory_buf_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar5;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff7c;
  value_type local_80;
  size_t local_78 [6];
  undefined8 local_48;
  value_type local_20;
  value_type *local_18;
  value_type local_10;
  undefined1 *local_8;
  
  local_48 = 0x18;
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffff60,
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,
                               CONCAT15(in_stack_ffffffffffffff5d,
                                        CONCAT14(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                )))),in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  ppcVar1 = std::array<const_char_*,_7UL>::operator[]
                      ((array<const_char_*,_7UL> *)in_stack_ffffffffffffff40,
                       (size_type)in_stack_ffffffffffffff38);
  local_20 = *ppcVar1;
  local_18 = &local_80;
  psVar3 = local_78;
  local_80 = local_20;
  dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)0x21979f);
  *psVar3 = (size_t)dest_00;
  view.data_._4_1_ = in_stack_ffffffffffffff5c;
  view.data_._0_4_ = in_stack_ffffffffffffff58;
  view.data_._5_1_ = in_stack_ffffffffffffff5d;
  view.data_._6_1_ = in_stack_ffffffffffffff5e;
  view.data_._7_1_ = in_stack_ffffffffffffff5f;
  view.size_ = (size_t)in_stack_ffffffffffffff60;
  fmt_helper::append_string_view(view,dest_00);
  uVar5 = CONCAT13(0x20,(int3)in_stack_ffffffffffffff70);
  fmt::v9::detail::buffer<char>::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ppcVar2 = std::array<const_char_*,_12UL>::operator[]
                      ((array<const_char_*,_12UL> *)in_stack_ffffffffffffff40,
                       (size_type)in_stack_ffffffffffffff38);
  pcVar4 = *ppcVar2;
  local_8 = &stack0xffffffffffffff60;
  psVar3 = (size_t *)&stack0xffffffffffffff68;
  local_10 = pcVar4;
  this_00 = (scoped_padder *)std::char_traits<char>::length((char_type *)0x21983d);
  *psVar3 = (size_t)this_00;
  view_00.data_._4_1_ = in_stack_ffffffffffffff5c;
  view_00.data_._0_4_ = in_stack_ffffffffffffff58;
  view_00.data_._5_1_ = in_stack_ffffffffffffff5d;
  view_00.data_._6_1_ = in_stack_ffffffffffffff5e;
  view_00.data_._7_1_ = in_stack_ffffffffffffff5f;
  view_00.size_ = (size_t)pcVar4;
  fmt_helper::append_string_view(view_00,dest_00);
  fmt::v9::detail::buffer<char>::push_back((buffer<char> *)this_00,(char *)psVar3);
  fmt_helper::append_int<int>(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  fmt::v9::detail::buffer<char>::push_back((buffer<char> *)this_00,(char *)psVar3);
  fmt_helper::pad2(in_stack_ffffffffffffff7c,
                   (memory_buf_t *)CONCAT44(in_stack_ffffffffffffff74,uVar5));
  fmt::v9::detail::buffer<char>::push_back((buffer<char> *)this_00,(char *)psVar3);
  fmt_helper::pad2(in_stack_ffffffffffffff7c,
                   (memory_buf_t *)CONCAT44(in_stack_ffffffffffffff74,uVar5));
  fmt::v9::detail::buffer<char>::push_back((buffer<char> *)this_00,(char *)psVar3);
  fmt_helper::pad2(in_stack_ffffffffffffff7c,
                   (memory_buf_t *)CONCAT44(in_stack_ffffffffffffff74,uVar5));
  fmt::v9::detail::buffer<char>::push_back((buffer<char> *)this_00,(char *)psVar3);
  fmt_helper::append_int<int>(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  scoped_padder::~scoped_padder(this_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }